

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O2

bool __thiscall efsw::FileInfo::operator==(FileInfo *this,FileInfo *Other)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = memcmp(&this->ModificationTime,&Other->ModificationTime,0x1c);
  if (iVar1 == 0) {
    bVar2 = this->Inode == Other->Inode;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FileInfo::operator==( const FileInfo& Other ) const {
	return ( ModificationTime == Other.ModificationTime && Size == Other.Size &&
			 OwnerId == Other.OwnerId && GroupId == Other.GroupId &&
			 Permissions == Other.Permissions && Inode == Other.Inode );
}